

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_interpreter_applyCoercionToASTNodeIntoType
          (sysbvm_context_t *context,sysbvm_tuple_t astNode_,sysbvm_tuple_t environment_,
          sysbvm_tuple_t targetType_)

{
  sysbvm_tuple_t sVar1;
  _Bool _Var2;
  anon_struct_40_5_5b8d8dc5 gcFrame;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  anon_struct_40_5_5b8d8dc5 *local_30;
  sysbvm_tuple_t local_28;
  sysbvm_tuple_t local_20;
  sysbvm_tuple_t local_18;
  
  local_30 = &gcFrame;
  gcFrame.nodeType = 0;
  gcFrame.coercionExpressionType = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 5;
  gcFrame.targetType = targetType_;
  gcFrame.environment = environment_;
  gcFrame.result = astNode_;
  sysbvm_stackFrame_pushRecord(&local_48);
  if (gcFrame.targetType == 0) {
    gcFrame.targetType = (context->roots).decayedTypeInferenceType;
  }
  if (gcFrame.targetType != (context->roots).directTypeInferenceType) {
    if ((gcFrame.result & 0xf) == 0 && gcFrame.result != 0) {
      gcFrame.nodeType = *(sysbvm_tuple_t *)(gcFrame.result + 0x20);
    }
    else {
      gcFrame.nodeType = 0;
    }
    if (gcFrame.targetType == (context->roots).decayedTypeInferenceType) {
      gcFrame.targetType = sysbvm_type_decay(context,gcFrame.nodeType);
    }
    else if (gcFrame.targetType == (context->roots).receiverTypeInferenceType) {
      gcFrame.targetType = sysbvm_type_decayReceiver(context,gcFrame.nodeType);
    }
    sVar1 = gcFrame.targetType;
    if ((gcFrame.targetType != 0) &&
       (_Var2 = sysbvm_type_isDirectSubtypeOf(gcFrame.nodeType,gcFrame.targetType), !_Var2)) {
      local_20 = gcFrame.result;
      local_18 = gcFrame.environment;
      local_28 = sVar1;
      gcFrame.result =
           sysbvm_tuple_send(context,(context->roots).coerceASTNodeWithEnvironmentSelector,3,
                             &local_28,0);
      gcFrame.result =
           sysbvm_interpreter_analyzeASTIfNeededWithEnvironment
                     (context,gcFrame.result,gcFrame.environment);
    }
  }
  sysbvm_stackFrame_popRecord(&local_48);
  return gcFrame.result;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_applyCoercionToASTNodeIntoType(sysbvm_context_t *context, sysbvm_tuple_t astNode_, sysbvm_tuple_t environment_, sysbvm_tuple_t targetType_)
{
    struct {
        sysbvm_tuple_t targetType;
        sysbvm_tuple_t environment;
        sysbvm_tuple_t nodeType;
        sysbvm_tuple_t result;

        sysbvm_tuple_t coercionExpressionType;
    } gcFrame = {
        .result = astNode_,
        .targetType = targetType_,
        .environment = environment_
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    if(!gcFrame.targetType)
        gcFrame.targetType = context->roots.decayedTypeInferenceType;

    // We do not need to perform type checking when just passing the type.
    if(gcFrame.targetType != context->roots.directTypeInferenceType)
    {
        gcFrame.nodeType = sysbvm_astNode_getAnalyzedType(gcFrame.result);
        bool isDecayedType = gcFrame.targetType == context->roots.decayedTypeInferenceType;
        bool isReceiverType = gcFrame.targetType == context->roots.receiverTypeInferenceType;

        if(isDecayedType)
            gcFrame.targetType = sysbvm_type_decay(context, gcFrame.nodeType);
        else if(isReceiverType)
            gcFrame.targetType = sysbvm_type_decayReceiver(context, gcFrame.nodeType);

        if(gcFrame.targetType && !sysbvm_type_isDirectSubtypeOf(gcFrame.nodeType, gcFrame.targetType))
        {
            gcFrame.result = sysbvm_tuple_send2(context, context->roots.coerceASTNodeWithEnvironmentSelector, gcFrame.targetType, gcFrame.result, gcFrame.environment);
            gcFrame.result = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment(context, gcFrame.result, gcFrame.environment);
        }
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}